

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.cc
# Opt level: O2

int EVP_HPKE_KEY_generate(EVP_HPKE_KEY *key,EVP_HPKE_KEM *kem)

{
  int iVar1;
  
  key->public_key[0x30] = '\0';
  key->public_key[0x31] = '\0';
  key->public_key[0x32] = '\0';
  key->public_key[0x33] = '\0';
  key->public_key[0x34] = '\0';
  key->public_key[0x35] = '\0';
  key->public_key[0x36] = '\0';
  key->public_key[0x37] = '\0';
  key->public_key[0x38] = '\0';
  key->public_key[0x39] = '\0';
  key->public_key[0x3a] = '\0';
  key->public_key[0x3b] = '\0';
  key->public_key[0x3c] = '\0';
  key->public_key[0x3d] = '\0';
  key->public_key[0x3e] = '\0';
  key->public_key[0x3f] = '\0';
  key->public_key[0x20] = '\0';
  key->public_key[0x21] = '\0';
  key->public_key[0x22] = '\0';
  key->public_key[0x23] = '\0';
  key->public_key[0x24] = '\0';
  key->public_key[0x25] = '\0';
  key->public_key[0x26] = '\0';
  key->public_key[0x27] = '\0';
  key->public_key[0x28] = '\0';
  key->public_key[0x29] = '\0';
  key->public_key[0x2a] = '\0';
  key->public_key[0x2b] = '\0';
  key->public_key[0x2c] = '\0';
  key->public_key[0x2d] = '\0';
  key->public_key[0x2e] = '\0';
  key->public_key[0x2f] = '\0';
  key->public_key[0x10] = '\0';
  key->public_key[0x11] = '\0';
  key->public_key[0x12] = '\0';
  key->public_key[0x13] = '\0';
  key->public_key[0x14] = '\0';
  key->public_key[0x15] = '\0';
  key->public_key[0x16] = '\0';
  key->public_key[0x17] = '\0';
  key->public_key[0x18] = '\0';
  key->public_key[0x19] = '\0';
  key->public_key[0x1a] = '\0';
  key->public_key[0x1b] = '\0';
  key->public_key[0x1c] = '\0';
  key->public_key[0x1d] = '\0';
  key->public_key[0x1e] = '\0';
  key->public_key[0x1f] = '\0';
  key->public_key[0] = '\0';
  key->public_key[1] = '\0';
  key->public_key[2] = '\0';
  key->public_key[3] = '\0';
  key->public_key[4] = '\0';
  key->public_key[5] = '\0';
  key->public_key[6] = '\0';
  key->public_key[7] = '\0';
  key->public_key[8] = '\0';
  key->public_key[9] = '\0';
  key->public_key[10] = '\0';
  key->public_key[0xb] = '\0';
  key->public_key[0xc] = '\0';
  key->public_key[0xd] = '\0';
  key->public_key[0xe] = '\0';
  key->public_key[0xf] = '\0';
  key->private_key[0x10] = '\0';
  key->private_key[0x11] = '\0';
  key->private_key[0x12] = '\0';
  key->private_key[0x13] = '\0';
  key->private_key[0x14] = '\0';
  key->private_key[0x15] = '\0';
  key->private_key[0x16] = '\0';
  key->private_key[0x17] = '\0';
  key->private_key[0x18] = '\0';
  key->private_key[0x19] = '\0';
  key->private_key[0x1a] = '\0';
  key->private_key[0x1b] = '\0';
  key->private_key[0x1c] = '\0';
  key->private_key[0x1d] = '\0';
  key->private_key[0x1e] = '\0';
  key->private_key[0x1f] = '\0';
  key->private_key[0] = '\0';
  key->private_key[1] = '\0';
  key->private_key[2] = '\0';
  key->private_key[3] = '\0';
  key->private_key[4] = '\0';
  key->private_key[5] = '\0';
  key->private_key[6] = '\0';
  key->private_key[7] = '\0';
  key->private_key[8] = '\0';
  key->private_key[9] = '\0';
  key->private_key[10] = '\0';
  key->private_key[0xb] = '\0';
  key->private_key[0xc] = '\0';
  key->private_key[0xd] = '\0';
  key->private_key[0xe] = '\0';
  key->private_key[0xf] = '\0';
  *(undefined8 *)(key->public_key + 0x40) = 0;
  key->kem = kem;
  iVar1 = (*kem->generate_key)(key);
  if (iVar1 == 0) {
    key->kem = (EVP_HPKE_KEM *)0x0;
  }
  return (uint)(iVar1 != 0);
}

Assistant:

int EVP_HPKE_KEY_generate(EVP_HPKE_KEY *key, const EVP_HPKE_KEM *kem) {
  EVP_HPKE_KEY_zero(key);
  key->kem = kem;
  if (!kem->generate_key(key)) {
    key->kem = NULL;
    return 0;
  }
  return 1;
}